

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O2

ProtoElement *
google::protobuf::internal::
down_cast<google::protobuf::util::converter::ProtoWriter::ProtoElement*,google::protobuf::util::converter::StructuredObjectWriter::BaseElement>
          (BaseElement *f)

{
  long lVar1;
  
  if (f != (BaseElement *)0x0) {
    lVar1 = __dynamic_cast(f,&util::converter::StructuredObjectWriter::BaseElement::typeinfo,
                           &util::converter::ProtoWriter::ProtoElement::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/casts.h"
                    ,0x5e,
                    "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::util::converter::ProtoWriter::ProtoElement *, From = google::protobuf::util::converter::StructuredObjectWriter::BaseElement]"
                   );
    }
  }
  return (ProtoElement *)f;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}